

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

uint64_t __thiscall doublechecked::Roaring::andnot_cardinality(Roaring *this,Roaring *r)

{
  uint uVar1;
  bool bVar2;
  reference puVar3;
  reference puVar4;
  uint64_t count;
  iterator r_it_end;
  iterator r_it;
  iterator it_end;
  iterator it;
  uint64_t ans;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  char *expression;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  char *local_18;
  
  local_18 = (char *)roaring::Roaring::andnot_cardinality
                               ((Roaring *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (Roaring *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_30._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_38._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar2 = std::operator==(&local_20,&local_28);
  if (bVar2) {
    _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,
                 (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c);
  }
  else {
    bVar2 = std::operator==(&local_30,&local_38);
    if (bVar2) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 0x10e31b);
      _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   in_stack_ffffffffffffff88,
                   (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff7c);
    }
    else {
      puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)0x10e357);
      uVar1 = *puVar3;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      puVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                         ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      bVar2 = true;
      if (uVar1 <= *puVar4) {
        puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x10e395);
        in_stack_ffffffffffffff94 = *puVar3;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        puVar4 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                           ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                            CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        bVar2 = *puVar4 < in_stack_ffffffffffffff94;
      }
      if (bVar2) {
        expression = local_18;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   0x10e3ea);
        _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),expression,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c);
      }
      else {
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   0x10e42a);
        while( true ) {
          bVar2 = std::operator!=(&local_20,&local_28);
          in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
          if (bVar2) {
            bVar2 = std::operator!=(&local_30,&local_38);
            in_stack_ffffffffffffff84 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff84);
          }
          if ((char)(in_stack_ffffffffffffff84 >> 0x18) == '\0') break;
          puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                             ((_Rb_tree_const_iterator<unsigned_int> *)0x10e477);
          in_stack_ffffffffffffff80 = *puVar3;
          puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                             ((_Rb_tree_const_iterator<unsigned_int> *)0x10e487);
          if (in_stack_ffffffffffffff80 == *puVar3) {
            std::_Rb_tree_const_iterator<unsigned_int>::operator++
                      ((_Rb_tree_const_iterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
            std::_Rb_tree_const_iterator<unsigned_int>::operator++
                      ((_Rb_tree_const_iterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
          }
          else {
            puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                               ((_Rb_tree_const_iterator<unsigned_int> *)0x10e4c0);
            in_stack_ffffffffffffff7c = *puVar3;
            puVar3 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                               ((_Rb_tree_const_iterator<unsigned_int> *)0x10e4d0);
            if (in_stack_ffffffffffffff7c < *puVar3) {
              std::_Rb_tree_const_iterator<unsigned_int>::operator++
                        ((_Rb_tree_const_iterator<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
            }
            else {
              std::_Rb_tree_const_iterator<unsigned_int>::operator++
                        ((_Rb_tree_const_iterator<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
            }
          }
        }
        _assert_true(CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,
                     (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff7c);
      }
    }
  }
  return (uint64_t)local_18;
}

Assistant:

uint64_t andnot_cardinality(const Roaring &r) const {
        uint64_t ans = plain.andnot_cardinality(r.plain);

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            assert_true(ans == 0);
        }  // this empty
        else if (r_it == r_it_end) {
            assert_true(ans == check.size());
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            assert_true(ans == check.size());  // disjoint so nothing removed
        } else {                               // may overlap
            uint64_t count = check.size();     // start with cardinality of this
            while (it != it_end && r_it != r_it_end) {
                if (*it == *r_it) {
                    --count;
                    ++it;
                    ++r_it;
                }  // remove overlap
                else if (*it < *r_it) {
                    ++it;
                } else {
                    ++r_it;
                }
            }
            assert_true(ans == count);
        }

        return ans;
    }